

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  size_t sVar2;
  
  printOpenHeader(this,_name);
  poVar1 = (this->super_StreamingReporterBase).stream;
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam0000000000164540 = 0x2e2e2e2e2e2e2e;
    uRam0000000000164547._0_1_ = '.';
    uRam0000000000164547._1_1_ = '.';
    uRam0000000000164547._2_1_ = '.';
    uRam0000000000164547._3_1_ = '.';
    uRam0000000000164547._4_1_ = '.';
    uRam0000000000164547._5_1_ = '.';
    uRam0000000000164547._6_1_ = '.';
    uRam0000000000164547._7_1_ = '.';
    DAT_00164530 = '.';
    DAT_00164530_1._0_1_ = '.';
    DAT_00164530_1._1_1_ = '.';
    DAT_00164530_1._2_1_ = '.';
    DAT_00164530_1._3_1_ = '.';
    DAT_00164530_1._4_1_ = '.';
    DAT_00164530_1._5_1_ = '.';
    DAT_00164530_1._6_1_ = '.';
    uRam0000000000164538 = 0x2e2e2e2e2e2e2e;
    DAT_0016453f = 0x2e;
    DAT_00164520 = '.';
    DAT_00164520_1._0_1_ = '.';
    DAT_00164520_1._1_1_ = '.';
    DAT_00164520_1._2_1_ = '.';
    DAT_00164520_1._3_1_ = '.';
    DAT_00164520_1._4_1_ = '.';
    DAT_00164520_1._5_1_ = '.';
    DAT_00164520_1._6_1_ = '.';
    uRam0000000000164528._0_1_ = '.';
    uRam0000000000164528._1_1_ = '.';
    uRam0000000000164528._2_1_ = '.';
    uRam0000000000164528._3_1_ = '.';
    uRam0000000000164528._4_1_ = '.';
    uRam0000000000164528._5_1_ = '.';
    uRam0000000000164528._6_1_ = '.';
    uRam0000000000164528._7_1_ = '.';
    DAT_00164510 = '.';
    DAT_00164510_1._0_1_ = '.';
    DAT_00164510_1._1_1_ = '.';
    DAT_00164510_1._2_1_ = '.';
    DAT_00164510_1._3_1_ = '.';
    DAT_00164510_1._4_1_ = '.';
    DAT_00164510_1._5_1_ = '.';
    DAT_00164510_1._6_1_ = '.';
    uRam0000000000164518._0_1_ = '.';
    uRam0000000000164518._1_1_ = '.';
    uRam0000000000164518._2_1_ = '.';
    uRam0000000000164518._3_1_ = '.';
    uRam0000000000164518._4_1_ = '.';
    uRam0000000000164518._5_1_ = '.';
    uRam0000000000164518._6_1_ = '.';
    uRam0000000000164518._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam0000000000164508._0_1_ = '.';
    uRam0000000000164508._1_1_ = '.';
    uRam0000000000164508._2_1_ = '.';
    uRam0000000000164508._3_1_ = '.';
    uRam0000000000164508._4_1_ = '.';
    uRam0000000000164508._5_1_ = '.';
    uRam0000000000164508._6_1_ = '.';
    uRam0000000000164508._7_1_ = '.';
    DAT_0016454f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)46>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)46>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  return;
}

Assistant:

void printClosedHeader( std::string const& _name ) {
            printOpenHeader( _name );
            stream << getLineOfChars<'.'>() << "\n";
        }